

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListFile.cpp
# Opt level: O3

size_t ListFile_GetNextLine(void *pvListFile,char **pszLineBegin,char **pszLineEnd)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  
  pcVar4 = *(char **)((long)pvListFile + 8);
  pcVar2 = *(char **)((long)pvListFile + 0x10);
  pcVar5 = pcVar4;
  if (pcVar4 < pcVar2) {
    do {
      pcVar5 = pcVar4;
      if (' ' < *pcVar4) break;
      pcVar4 = pcVar4 + 1;
      *(char **)((long)pvListFile + 8) = pcVar4;
      pcVar5 = pcVar2;
    } while (pcVar4 != pcVar2);
  }
  pcVar4 = pcVar5;
  if (pcVar5 < pcVar2) {
    lVar6 = (long)pcVar2 - (long)pcVar5;
    pcVar2 = pcVar5 + lVar6;
    pcVar3 = pcVar5;
    pcVar7 = (char *)0x0;
    do {
      cVar1 = *pcVar3;
      pcVar8 = pcVar3;
      if ((cVar1 != '~') && ((pcVar4 = pcVar3, pcVar8 = pcVar7, cVar1 == '\n' || (cVar1 == '\r'))))
      break;
      pcVar3 = pcVar3 + 1;
      *(char **)((long)pvListFile + 8) = pcVar3;
      lVar6 = lVar6 + -1;
      pcVar4 = pcVar2;
      pcVar7 = pcVar8;
    } while (lVar6 != 0);
    if (((pcVar8 != (char *)0x0) && (*pcVar8 == '~')) && (pcVar8[1] == 'P')) {
      pcVar4 = pcVar8;
    }
  }
  *pszLineBegin = pcVar5;
  *pszLineEnd = pcVar4;
  return (long)pcVar4 - (long)pcVar5;
}

Assistant:

size_t ListFile_GetNextLine(void * pvListFile, const char ** pszLineBegin, const char ** pszLineEnd)
{
    PLISTFILE_CACHE pCache = (PLISTFILE_CACHE)pvListFile;
    char * szExtraString = NULL;
    char * szLineBegin;
    char * szLineEnd;

    // Skip newlines, spaces, tabs and another non-printable stuff
    while(pCache->pPos < pCache->pEnd && pCache->pPos[0] <= 0x20)
        pCache->pPos++;

    // Remember the begin of the line
    szLineBegin = pCache->pPos;

    // Copy the remaining characters
    while(pCache->pPos < pCache->pEnd)
    {
        // If we have found a newline, stop loading
        // Note: the 0x85 char came from Overwatch build 24919
        if(pCache->pPos[0] == 0x0A || pCache->pPos[0] == 0x0D || pCache->pPos[0] == 0x85)
            break;

        // Blizzard listfiles can also contain information about patch:
        // Pass1\Files\MacOS\unconditional\user\Background Downloader.app\Contents\Info.plist~Patch(Data#frFR#base-frFR,1326)
        if(pCache->pPos[0] == '~')
            szExtraString = pCache->pPos;

        // Move the position by one character forward
        pCache->pPos++;
    }

    // Remember the end of the line
    szLineEnd = (szExtraString != NULL && szExtraString[0] == '~' && szExtraString[1] == 'P') ? szExtraString : pCache->pPos;

    // Give the caller the positions of the begin and end of the line
    pszLineBegin[0] = szLineBegin;
    pszLineEnd[0] = szLineEnd;
    return (size_t)(szLineEnd - szLineBegin);
}